

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

Ref __thiscall gnilk::LogManager::GetOrAddLog(LogManager *this,string *name)

{
  pthread_mutex_t *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  int iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref RVar8;
  Ref instance;
  Ref writer;
  Ref local_58;
  element_type *local_48;
  _Alloc_hider local_40;
  element_type *local_38;
  undefined8 local_30;
  
  __mutex = (pthread_mutex_t *)(name + 2);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    this_00 = &name[4].field_2;
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this_00,in_RDX);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      Log::Create((Log *)&local_38,in_RDX);
      local_58.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
      local_58.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_30 + 8) = *(_Atomic_word *)(local_30 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_30 + 8) = *(_Atomic_word *)(local_30 + 8) + 1;
        }
      }
      LogInstance::Create((LogInstance *)&local_48,in_RDX,&local_58);
      if (local_58.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      peVar3 = (local_48->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (local_48->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        peVar3->isEnabled = *(bool *)((long)&name->_M_string_length + 1);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        peVar3->isEnabled = *(bool *)((long)&name->_M_string_length + 1);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00->_M_local_buf,in_RDX);
      (pmVar6->super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_48
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar6->super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40);
      this->_vptr_LogManager =
           (_func_int **)
           (local_48->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (local_48->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->isInitialized = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
      }
    }
    else {
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00->_M_local_buf,in_RDX);
      peVar1 = (pmVar6->super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this->_vptr_LogManager =
           (_func_int **)
           (peVar1->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (peVar1->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->isInitialized = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
    }
    pthread_mutex_unlock(__mutex);
    RVar8.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    RVar8.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (Ref)RVar8.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar7 = std::__throw_system_error(iVar4);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar7);
}

Assistant:

Log::Ref LogManager::GetOrAddLog(const std::string &name) {
    std::lock_guard<std::mutex> lock(instLock);

    if (logInstances.find(name) != logInstances.end()) {
        return logInstances[name]->GetLog();
    }
    // Create the writer and the instance...
    auto writer = Log::Create(name);
    auto instance = LogInstance::Create(name, writer);

    instance->GetLog()->SetEnabled(enableLogOnCreate);

    logInstances[name] = instance;
    return instance->GetLog();
}